

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O3

void __thiscall
cmCTest::PopulateCustomVector
          (cmCTest *this,cmMakefile *mf,string *def,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *vec)

{
  char *__s;
  ostream *poVar1;
  size_t sVar2;
  pointer pbVar3;
  ostringstream cmCTestLog_msg;
  long *local_1d0;
  long local_1c0 [2];
  cmCTest *local_1b0;
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198 [6];
  ios_base local_138 [264];
  
  local_1b0 = this;
  __s = cmMakefile::GetDefinition(mf,def);
  if (__s != (char *)0x0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"PopulateCustomVector: ",0x16);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,(def->_M_dataplus)._M_p,def->_M_string_length);
    std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(local_1b0,0,
        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx",
        0x92e,(char *)local_1d0,false);
    if (local_1d0 != local_1c0) {
      operator_delete(local_1d0,local_1c0[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(vec,(vec->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start);
    local_1a8._0_8_ = local_1a8 + 0x10;
    sVar2 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,__s,__s + sVar2);
    cmSystemTools::ExpandListArgument((string *)local_1a8,vec,false);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_198[0]._M_allocated_capacity + 1);
    }
    pbVar3 = (vec->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (pbVar3 != (vec->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"  -- ",5);
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(pbVar3->_M_dataplus)._M_p,pbVar3->_M_string_length
                           );
        std::ios::widen((char)poVar1->_vptr_basic_ostream[-3] + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(local_1b0,0,
            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/cmCTest.cxx"
            ,0x935,(char *)local_1d0,false);
        if (local_1d0 != local_1c0) {
          operator_delete(local_1d0,local_1c0[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        pbVar3 = pbVar3 + 1;
      } while (pbVar3 != (vec->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  return;
}

Assistant:

void cmCTest::PopulateCustomVector(cmMakefile* mf, const std::string& def,
                                   std::vector<std::string>& vec)
{
  const char* dval = mf->GetDefinition(def);
  if (!dval) {
    return;
  }
  cmCTestLog(this, DEBUG, "PopulateCustomVector: " << def << std::endl);

  vec.clear();
  cmSystemTools::ExpandListArgument(dval, vec);

  for (std::vector<std::string>::const_iterator it = vec.begin();
       it != vec.end(); ++it) {
    cmCTestLog(this, DEBUG, "  -- " << *it << std::endl);
  }
}